

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_Arena_Test::TestBody
          (DynamicMessageTest_Arena_Test *this)

{
  Arena arena;
  ThreadSafeArena TStack_b8;
  
  internal::ThreadSafeArena::ThreadSafeArena(&TStack_b8);
  MessageLite::New(&((this->super_DynamicMessageTest).prototype_)->super_MessageLite,
                   (Arena *)&TStack_b8);
  MessageLite::New(&((this->super_DynamicMessageTest).extensions_prototype_)->super_MessageLite,
                   (Arena *)&TStack_b8);
  MessageLite::New(&((this->super_DynamicMessageTest).packed_prototype_)->super_MessageLite,
                   (Arena *)&TStack_b8);
  MessageLite::New(&((this->super_DynamicMessageTest).oneof_prototype_)->super_MessageLite,
                   (Arena *)&TStack_b8);
  internal::ThreadSafeArena::~ThreadSafeArena(&TStack_b8);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Arena) {
  Arena arena;
  Message* message = prototype_->New(&arena);
  Message* extension_message = extensions_prototype_->New(&arena);
  Message* packed_message = packed_prototype_->New(&arena);
  Message* oneof_message = oneof_prototype_->New(&arena);

  // avoid unused-variable error.
  (void)message;
  (void)extension_message;
  (void)packed_message;
  (void)oneof_message;
  // Return without freeing: should not leak.
}